

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::Array<char>_> *
kj::parse::Many_<const_kj::parse::CharGroup__&,_true>::
Impl<capnp::compiler::Lexer::ParserInput,_char>::apply
          (Maybe<kj::Array<char>_> *__return_storage_ptr__,CharGroup_ *subParser,ParserInput *input)

{
  byte bVar1;
  char *pcVar2;
  RemoveConst<char> *pRVar3;
  char *pcVar4;
  Maybe<kj::Array<char>_> *pMVar5;
  byte *pbVar6;
  byte *pbVar7;
  size_t sVar8;
  ulong uVar9;
  Results results;
  Vector<char> local_58;
  Maybe<kj::Array<char>_> *local_38;
  
  local_58.builder.ptr = (char *)0x0;
  local_58.builder.pos = (RemoveConst<char> *)0x0;
  local_58.builder.endPtr = (char *)0x0;
  local_38 = __return_storage_ptr__;
  do {
    pbVar6 = (byte *)(input->super_IteratorInput<char,_const_char_*>).pos;
    if (pbVar6 == (byte *)(input->super_IteratorInput<char,_const_char_*>).end) break;
    bVar1 = *pbVar6;
    uVar9 = 1L << (bVar1 & 0x3f);
    pbVar7 = pbVar6 + ((uVar9 & subParser->bits[bVar1 >> 6]) != 0);
    uVar9 = uVar9 & subParser->bits[bVar1 >> 6];
    if (uVar9 == 0) {
      if (pbVar6 < pbVar7) {
        pbVar6 = pbVar7;
      }
      pbVar7 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
      if (pbVar6 <= pbVar7) {
        pbVar6 = pbVar7;
      }
      (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar6;
      break;
    }
    (input->super_IteratorInput<char,_const_char_*>).pos = (char *)pbVar7;
    if (local_58.builder.pos == local_58.builder.endPtr) {
      sVar8 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
      if (local_58.builder.endPtr == local_58.builder.ptr) {
        sVar8 = 4;
      }
      Vector<char>::setCapacity(&local_58,sVar8);
    }
    *local_58.builder.pos = bVar1;
    local_58.builder.pos = local_58.builder.pos + 1;
    if (pbVar7 <= pbVar6) {
      pbVar7 = pbVar6;
    }
    pbVar6 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
    if (pbVar7 <= pbVar6) {
      pbVar7 = pbVar6;
    }
    (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar7;
  } while (uVar9 != 0);
  pMVar5 = local_38;
  if ((long)local_58.builder.pos - (long)local_58.builder.ptr == 0) {
    (local_38->ptr).isSet = false;
  }
  else {
    if (local_58.builder.pos != local_58.builder.endPtr) {
      Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
    }
    pcVar2 = local_58.builder.ptr;
    sVar8 = (long)local_58.builder.pos - (long)local_58.builder.ptr;
    local_58.builder.ptr = (char *)0x0;
    local_58.builder.pos = (RemoveConst<char> *)0x0;
    local_58.builder.endPtr = (char *)0x0;
    (pMVar5->ptr).isSet = true;
    (pMVar5->ptr).field_1.value.ptr = pcVar2;
    (pMVar5->ptr).field_1.value.size_ = sVar8;
    (pMVar5->ptr).field_1.value.disposer = local_58.builder.disposer;
  }
  pcVar4 = local_58.builder.endPtr;
  pRVar3 = local_58.builder.pos;
  pcVar2 = local_58.builder.ptr;
  if ((byte *)local_58.builder.ptr != (byte *)0x0) {
    local_58.builder.ptr = (char *)0x0;
    local_58.builder.pos = (RemoveConst<char> *)0x0;
    local_58.builder.endPtr = (char *)0x0;
    (**(local_58.builder.disposer)->_vptr_ArrayDisposer)
              (local_58.builder.disposer,pcVar2,1,(long)pRVar3 - (long)pcVar2,
               (long)pcVar4 - (long)pcVar2,0);
  }
  return pMVar5;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }